

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puppet.hpp
# Opt level: O2

void henson::Puppet::exec(void *self_)

{
  undefined4 uVar1;
  time_type tVar2;
  
  do {
    *(undefined1 *)((long)self_ + 0x20) = 1;
    tVar2 = get_time();
    *(time_type *)((long)self_ + 0x30) = tVar2;
    uVar1 = (**(code **)((long)self_ + 0xb0))
                      (*(undefined4 *)((long)self_ + 0x90),*(undefined8 *)((long)self_ + 0x98));
    *(undefined4 *)((long)self_ + 0x28) = uVar1;
    *(undefined1 *)((long)self_ + 0x20) = 0;
    Coroutine<henson::Puppet>::yield((Coroutine<henson::Puppet> *)self_);
  } while( true );
}

Assistant:

static void         exec(void* self_)
    {
        Puppet* self = (Puppet*) self_;

        while(true)
        {
            self->running_ = true;
            self->start_time_ = get_time();
            self->result_ = self->main_(self->argc_,&self->argv_[0]);
            self->running_ = false;
            self->yield();      // the time for the final portion will get recorded thanks to this call
        }
    }